

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_str.c
# Opt level: O3

size_t fiobj_str_vprintf(FIOBJ dest,char *format,__va_list_tag *argv)

{
  ulong uVar1;
  fio_str_info_s state;
  fio_str_info_s local_20;
  
  if (((uint)dest & 7) == 2) {
    uVar1 = dest & 0xfffffffffffffff8;
    if (*(char *)(uVar1 + 0x11) == '\0') {
      *(undefined8 *)(uVar1 + 8) = 0;
      fio_str_vprintf(&local_20,(fio_str_s_conflict *)(uVar1 + 0x10),format,argv);
    }
    else {
      local_20.len = 0;
    }
    return local_20.len;
  }
  __assert_fail("FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fiobj/fiobj_str.c"
                ,0x11b,"size_t fiobj_str_vprintf(FIOBJ, const char *, struct __va_list_tag *)");
}

Assistant:

size_t fiobj_str_vprintf(FIOBJ dest, const char *format, va_list argv) {
  assert(FIOBJ_TYPE_IS(dest, FIOBJ_T_STRING));
  if (obj2str(dest)->str.frozen)
    return 0;
  obj2str(dest)->hash = 0;
  fio_str_info_s state = fio_str_vprintf(&obj2str(dest)->str, format, argv);
  return state.len;
}